

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3cb2mllr_io.c
# Opt level: O0

int s3cb2mllr_read(char *fn,int32 **out_cb2mllr,uint32 *out_n_cb,uint32 *out_n_mllr)

{
  uint32 uVar1;
  int32 *piVar2;
  bool bVar3;
  int iVar4;
  void *ptr;
  uint local_50;
  int beg_hole;
  int in_hole;
  int32 *cb2mllr;
  int *did_map;
  int n_r;
  int n_d;
  int i;
  int ret;
  uint32 *out_n_mllr_local;
  uint32 *out_n_cb_local;
  int32 **out_cb2mllr_local;
  char *fn_local;
  
  bVar3 = false;
  local_50 = 0;
  iVar4 = s3map_read(fn,out_cb2mllr,out_n_cb,out_n_mllr,4);
  if (iVar4 == 0) {
    uVar1 = *out_n_cb;
    piVar2 = *out_cb2mllr;
    ptr = __ckd_calloc__((long)(int)*out_n_mllr,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                         ,0x50);
    for (n_r = 0; n_r < (int)uVar1; n_r = n_r + 1) {
      if ((int)*out_n_mllr <= piVar2[n_r]) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                ,0x55,"%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",fn,(ulong)(uint)n_r,
                piVar2[n_r],*out_n_mllr);
        exit(1);
      }
      if (-1 < piVar2[n_r]) {
        *(undefined4 *)((long)ptr + (long)piVar2[n_r] * 4) = 1;
      }
    }
    for (n_r = 0; n_r < (int)uVar1; n_r = n_r + 1) {
      if (-1 < piVar2[n_r]) {
        if ((!bVar3) && (*(int *)((long)ptr + (long)piVar2[n_r] * 4) == 0)) {
          local_50 = n_r;
          bVar3 = true;
        }
        if ((bVar3) && (*(int *)((long)ptr + (long)piVar2[n_r] * 4) == 1)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                  ,0x62,"cb unmapped in region [%u %u]\n",(ulong)local_50,(ulong)(n_r - 1));
          exit(1);
        }
      }
    }
    if (bVar3) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
              ,0x67,"cb unmapped in region [%u %u]\n",(ulong)local_50,(ulong)(n_r - 1));
      exit(1);
    }
    ckd_free(ptr);
  }
  return iVar4;
}

Assistant:

int
s3cb2mllr_read(const char *fn,
	       int32 **out_cb2mllr,
	       uint32 *out_n_cb,
	       uint32 *out_n_mllr)
{
    int ret, i, n_d, n_r;
    int *did_map;
    int32 *cb2mllr;
    int in_hole = FALSE;
    int beg_hole = 0;

    ret = s3map_read(fn,
		     (void **)out_cb2mllr,
		     out_n_cb,
		     out_n_mllr,
		     sizeof(int32));

    
    if (ret == S3_SUCCESS) {
	n_d = *out_n_cb;
	n_r = *out_n_mllr;
	cb2mllr = *out_cb2mllr;
	
	did_map = ckd_calloc(n_r, sizeof(int));

	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] >= (int32)*out_n_mllr) {
		E_FATAL("%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",
			fn, i, cb2mllr[i], *out_n_mllr);
	    }
	    else if (cb2mllr[i] >= 0)
		did_map[cb2mllr[i]] = IS_MAPPED;
	}
	
	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] < 0) continue; /* skipped */
	    if (!in_hole && (did_map[cb2mllr[i]] == NOT_MAPPED)) {
		beg_hole = i;
		in_hole = TRUE;
	    }
	    if (in_hole && (did_map[cb2mllr[i]] == IS_MAPPED)) {
		E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
		in_hole = FALSE;
	    }
	}
	if (in_hole) {
	    E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
	}

	ckd_free(did_map);
    }

    return ret;
}